

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O3

int h262_block(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,int32_t *block,int intra,
              int chroma)

{
  vs_vlc_val *pvVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  vs_vlc_val *pvVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint32_t dcd;
  uint32_t tmp;
  uint32_t eb2;
  uint32_t eb1;
  uint32_t sign;
  uint32_t el;
  uint32_t local_50;
  uint32_t local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  h262_seqparm *local_38;
  
  iVar7 = 0;
  local_38 = seqparm;
  if (intra != 0) {
    if (str->dir == VS_ENCODE) {
      local_50 = *block;
      uVar3 = -local_50;
      if (0 < (int)local_50) {
        uVar3 = local_50;
      }
      local_4c = 0xffffffff;
      do {
        local_4c = local_4c + 1;
        iVar7 = 1 << ((byte)local_4c & 0x1f);
      } while (iVar7 <= (int)uVar3);
      if ((int)local_50 < 0) {
        local_50 = (local_50 + iVar7) - 1;
      }
    }
    pvVar6 = dcs_chroma_vlc;
    if (chroma == 0) {
      pvVar6 = dcs_luma_vlc;
    }
    iVar7 = vs_vlc(str,&local_4c,pvVar6);
    if (iVar7 != 0) {
      return 1;
    }
    iVar7 = vs_u(str,&local_50,local_4c);
    if (iVar7 != 0) {
      return 1;
    }
    if (str->dir == VS_DECODE) {
      if (local_4c == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = local_50;
        if (local_50 >> ((byte)local_4c - 1 & 0x1f) == 0) {
          uVar5 = local_50 + (-1 << ((byte)local_4c & 0x1f)) + 1;
        }
      }
      *block = uVar5;
    }
    iVar7 = 1;
  }
  if (picparm->picture_coding_type == 4) {
    return 0;
  }
  do {
    if (((intra == 0) || (pvVar6 = block_intra_vlc, picparm->intra_vlc_format == 0)) &&
       (pvVar6 = block_vlc, iVar7 == 0)) {
      pvVar6 = block_0_vlc;
    }
    if (str->dir == VS_ENCODE) {
      if (iVar7 < 0x40) {
        local_50 = 0x40 - iVar7;
        uVar3 = 0;
        lVar9 = 0;
        do {
          if (block[iVar7 + lVar9] != 0) {
            local_50 = (uint32_t)lVar9;
            iVar7 = iVar7 + local_50;
            goto LAB_00104a54;
          }
          lVar9 = lVar9 + 1;
          uVar3 = uVar3 + 0x1000;
        } while (0x40 - (long)iVar7 != lVar9);
      }
      else {
        local_50 = 0;
        uVar3 = 0;
        if (iVar7 != 0x40) {
LAB_00104a54:
          uVar2 = block[iVar7];
          if (uVar2 - 0x800 < 0xfffff001) {
            h262_block_cold_2();
            return 1;
          }
          local_3c = uVar2 & 0xfff;
          uVar8 = -uVar2;
          if (0 < (int)uVar2) {
            uVar8 = uVar2;
          }
          local_4c = uVar3 | uVar8;
          local_40 = uVar2 >> 0x1f;
          iVar4 = pvVar6->blen;
          for (pvVar1 = pvVar6; (iVar4 != 0 && (pvVar1->val != local_4c)); pvVar1 = pvVar1 + 1) {
            iVar4 = pvVar1[1].blen;
          }
          if ((local_4c != (pvVar1->val == 0)) && (local_4c = 0xfffff, local_38->is_ext == 0)) {
            if (uVar8 < 0x7f) {
              local_44 = uVar2 & 0xff;
            }
            else {
              if (0xfe < uVar8) {
                h262_block_cold_1();
                return 1;
              }
              local_44 = uVar2 >> 0x18 & 0xffffff80;
              local_48 = uVar2 & 0xff;
            }
          }
          iVar7 = iVar7 + 1;
          goto LAB_00104b0a;
        }
      }
      local_4c = 0;
      iVar7 = 0x40;
    }
LAB_00104b0a:
    iVar4 = vs_vlc(str,&local_4c,pvVar6);
    if (iVar4 != 0) {
      return 1;
    }
    if (local_4c == 0xfffff) {
      iVar4 = vs_u(str,&local_50,6);
      if (iVar4 != 0) {
        return 1;
      }
      if (local_38->is_ext == 0) {
        iVar4 = vs_u(str,&local_44,8);
        if (iVar4 != 0) {
          return 1;
        }
        if (local_44 == 0x80) {
          iVar4 = vs_u(str,&local_48,8);
          if (iVar4 != 0) {
            return 1;
          }
          if (local_48 - 0x81 < 0xffffff80) {
            h262_block_cold_4();
            return 1;
          }
          uVar3 = local_48 | 0xffffff00;
        }
        else if (local_44 == 0) {
          iVar4 = vs_u(str,&local_48,8);
          if (iVar4 != 0) {
            return 1;
          }
          uVar3 = local_48;
          if (local_48 < 0x80) {
            h262_block_cold_5();
            return 1;
          }
        }
        else {
          uVar3 = local_44 | 0xffffff00;
          if ((int)local_44 < 0x81) {
            uVar3 = local_44;
          }
        }
      }
      else {
        iVar4 = vs_u(str,&local_3c,0xc);
        if (iVar4 != 0) {
          return 1;
        }
        uVar3 = local_3c | 0xfffff000;
        if ((local_3c >> 0xb & 1) == 0) {
          uVar3 = local_3c;
        }
        if ((local_3c & 0x7ff) == 0) {
          h262_block_cold_3();
          return 1;
        }
      }
    }
    else {
      if (local_4c == 0) {
        if (str->dir != VS_DECODE) {
          return 0;
        }
        if (iVar7 < 0x40) {
          memset(block + iVar7,0,(ulong)(0x3f - iVar7) * 4 + 4);
          return 0;
        }
        return 0;
      }
      iVar4 = vs_u(str,&local_40,1);
      if (iVar4 != 0) {
        return 1;
      }
      local_50 = local_4c >> 0xc;
      uVar3 = -(local_4c & 0xfff);
      if (local_40 == 0) {
        uVar3 = local_4c & 0xfff;
      }
    }
    if (str->dir == VS_DECODE) {
      if (0x3f < iVar7) {
        h262_block_cold_7();
        return 1;
      }
      if (local_50 != 0) {
        lVar9 = 0;
        do {
          if (0x40 - (long)iVar7 == lVar9) {
            h262_block_cold_6();
            return 1;
          }
          block[iVar7 + lVar9] = 0;
          lVar9 = lVar9 + 1;
        } while (local_50 != (uint)lVar9);
        iVar7 = iVar7 + (uint)lVar9;
      }
      lVar9 = (long)iVar7;
      iVar7 = iVar7 + 1;
      block[lVar9] = uVar3;
    }
  } while( true );
}

Assistant:

int h262_block(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, int32_t *block, int intra, int chroma) {
	int i = 0;
	if (intra) {
		uint32_t dcs;
		uint32_t dcd;
		if (str->dir == VS_ENCODE) {
			dcs = 0;
			while (abs(block[0]) >= (1 << dcs))
				dcs++;
			if (block[0] >= 0) {
				dcd = block[0];
			} else {
				dcd = block[0] + (1 << dcs) - 1;
			}
		}
		if (vs_vlc(str, &dcs, chroma?dcs_chroma_vlc:dcs_luma_vlc)) return 1;
		if (vs_u(str, &dcd, dcs)) return 1;
		if (str->dir == VS_DECODE) {
			if (!dcs) {
				block[0] = 0;
			} else {
				if (dcd >= (1 << (dcs - 1)))
					block[0] = dcd;
				else
					block[0] = dcd - ((1 << dcs) - 1);
			}
		}
		i = 1;
	}
	if (picparm->picture_coding_type == H262_PIC_TYPE_D)
		return 0;
	while (1) {
		uint32_t tmp, run, el, eb1, eb2, sign;
		int32_t coeff;
		const struct vs_vlc_val *tab;
		if (intra && picparm->intra_vlc_format)
			tab = block_intra_vlc;
		else if (i == 0)
			tab = block_0_vlc;
		else
			tab = block_vlc;
		if (str->dir == VS_ENCODE) {
			run = 0;
			while (i < 64 && !block[i])
				i++, run++;
			if (i == 64) {
				tmp = 0;
			} else {
				coeff = block[i];
				if (coeff <= -0x800 || coeff >= 0x800) {
					fprintf(stderr, "Coeff too large\n");
					return 1;
				}
				el = coeff & 0xfff;
				tmp = abs(coeff) | run << 12;
				sign = coeff < 0;
				int j;
				for (j = 0; tab[j].blen; j++) {
					if (tab[j].val == tmp) {
						break;
					}
				}
				if (!tab[j].val != tmp)
					tmp = 0xfffff;
				if (tmp == 0xfffff && !seqparm->is_ext) {
					/* make MPEG1 escape codes */
					if (abs(coeff) < 127) {
						eb1 = coeff & 0xff;
					} else if (abs(coeff) < 255) {
						if (coeff < 0)
							eb1 = 0x80;
						else
							eb1 = 0;
						eb2 = coeff & 0xff;
					} else {
						fprintf(stderr, "Coeff too large\n");
						return 1;
					}
				}
				i++;
			}
		}
		if (vs_vlc(str, &tmp, tab)) return 1;
		if (tmp == 0) {
			/* end of block */
			if (str->dir == VS_DECODE) {
				while (i < 64)
					block[i++] = 0;
			}
			return 0;
		} else if (tmp == 0xfffff) {
			if (vs_u(str, &run, 6)) return 1;
			if (seqparm->is_ext) {
				/* MPEG2 escape */
				if (vs_u(str, &el, 12)) return 1;
				if (el & 0x800)
					coeff = el | -0x1000;
				else
					coeff = el;
				if (!(el & 0x7ff)) {
					fprintf(stderr, "Invalid escape code\n");
					return 1;
				}
			} else {
				/* MPEG1 escape */
				if (vs_u(str, &eb1, 8)) return 1;
				if (eb1 == 0) {
					if (vs_u(str, &eb2, 8)) return 1;
					if (eb2 < 0x80) {
						fprintf(stderr, "Invalid escape code\n");
						return 1;
					}
					coeff = eb2;
				} else if (eb1 == 0x80) {
					if (vs_u(str, &eb2, 8)) return 1;
					if (eb2 == 0 || eb2 > 0x80) {
						fprintf(stderr, "Invalid escape code\n");
						return 1;
					}
					coeff = eb2 | -0x100;
				} else {
					coeff = eb1;
					if (coeff > 0x80)
						coeff |= -0x100;
				}
			}
		} else {
			/* normal coefficient */
			if (vs_u(str, &sign, 1)) return 1;
			run = tmp >> 12;
			if (sign)
				coeff = -(tmp & 0xfff);
			else
				coeff = tmp & 0xfff;
		}
		if (str->dir == VS_DECODE) {
			if (i >= 64) {
				fprintf(stderr, "block overflow\n");
				return 1;
			}
			while (run--) {
				if (i >= 64) {
					fprintf(stderr, "block overflow\n");
					return 1;
				}
				block[i++] = 0;
			}
			block[i++] = coeff;
		}
	}
}